

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int compound_statement(void)

{
  int iVar1;
  int extraout_EAX;
  char *pcVar2;
  socklen_t *in_RDX;
  socklen_t *__addr_len;
  sockaddr *in_RSI;
  int unaff_retaddr;
  int in_stack_00000010;
  int local_4;
  
  iVar1 = accept(0x7b,in_RSI,in_RDX);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    syms_inc_scope();
    ast_inc_scope(unaff_retaddr);
    iVar1 = accept(0x7d,in_RSI,__addr_len);
    if (iVar1 == 0) {
      iVar1 = declaration_list();
      if (iVar1 == 0) {
        iVar1 = statement_list();
        if (iVar1 == 0) {
          pcVar2 = token_name(last_id);
          err(E,"expected \'}\' or statement after %s",pcVar2);
        }
        else {
          iVar1 = expect(in_stack_00000010);
          if (iVar1 != 0) {
            ast_dec_scope();
            syms_dec_scope();
            return 1;
          }
        }
      }
      else {
        iVar1 = statement_list();
        if (iVar1 == 0) {
          iVar1 = expect(in_stack_00000010);
          if (iVar1 != 0) {
            ast_dec_scope();
            syms_dec_scope();
            return 1;
          }
        }
        else {
          iVar1 = expect(in_stack_00000010);
          if (iVar1 != 0) {
            ast_dec_scope();
            syms_dec_scope();
            return 1;
          }
        }
      }
      sync();
      if (extraout_EAX != 0) {
        ast_dec_scope();
        syms_dec_scope();
      }
      local_4 = 1;
    }
    else {
      ast_dec_scope();
      syms_dec_scope();
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int compound_statement()
{
    if (accept('{'))
    {
        ast_inc_scope(syms_inc_scope());

        if (accept('}'))
        {
            ast_dec_scope();
            syms_dec_scope();
            return 1;
        }
        else if (declaration_list())
        {
            if (statement_list())
            {
                if (expect('}'))
                {
                    ast_dec_scope();
                    syms_dec_scope();
                    return 1;
                }
            }
            else if (expect('}'))
            {
                ast_dec_scope();
                syms_dec_scope();
                return 1;
            }
        }
        else if (statement_list())
        {
            if (expect('}'))
            {
                ast_dec_scope();
                syms_dec_scope();
                return 1;
            }
        }
        else
        {
            err(E, "expected '}' or statement after %s", token_name(last_id));
        }


        if (sync("}"))
        {
            ast_dec_scope();
            syms_dec_scope();
        }

        return 1;
    }
    return 0;
}